

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<std::complex<double>_>::Subst_Forward
          (TPZMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  int iVar1;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined8 extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double in_XMM1_Qa;
  undefined1 local_88 [16];
  double local_78;
  double dStack_70;
  double local_60;
  undefined8 local_58;
  double local_50;
  double local_48;
  undefined1 local_40 [16];
  
  lVar5 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar2 = 0;
  if ((lVar5 == CONCAT44(extraout_var,iVar1)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    iVar2 = 1;
    if (CONCAT44(extraout_var_00,iVar1) != 0 && -1 < extraout_var_00) {
      lVar5 = 0;
      do {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar5);
        local_60 = in_XMM1_Qa;
        if (0 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol) {
          lVar3 = 0;
          local_58 = extraout_XMM0_Qa;
          do {
            if (lVar5 == 0) {
              local_78 = 0.0;
              dStack_70 = 0.0;
            }
            else {
              local_78 = 0.0;
              dStack_70 = 0.0;
              lVar4 = 0;
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar5,lVar4);
                local_50 = in_XMM1_Qa;
                local_48 = extraout_XMM0_Qa_00;
                (*(B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x24])(B,lVar4,lVar3);
                local_88._0_8_ = local_48;
                local_88._8_8_ = local_50;
                local_40._8_8_ = in_XMM1_Qa;
                std::complex<double>::operator*=
                          ((complex<double> *)local_88,(complex<double> *)local_40);
                local_78 = local_78 + (double)local_88._0_8_;
                dStack_70 = dStack_70 + (double)local_88._8_8_;
                lVar4 = lVar4 + 1;
              } while (lVar5 != lVar4);
            }
            (*(B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(B,lVar5,lVar3);
            in_XMM1_Qa = in_XMM1_Qa - dStack_70;
            local_88._0_8_ = __divdc3(extraout_XMM0_Qa_01 - local_78,in_XMM1_Qa,local_58,local_60);
            local_88._8_8_ = in_XMM1_Qa;
            (*(B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x23])(B,lVar5,lVar3,local_88);
            lVar3 = lVar3 + 1;
          } while (lVar3 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol);
        }
        lVar5 = lVar5 + 1;
        iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
      } while (lVar5 < CONCAT44(extraout_var_01,iVar1));
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int TPZMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky)
		return( 0 );
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols();  c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
			//
			TVar sum = 0.0;
			for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
			// Faz B[r,c] = (B[r,c] - sum) / A[r,r].
			//
			B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
		}
	}
	return( 1 );
}